

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

ColumnData * __thiscall duckdb::RowGroup::GetColumn(RowGroup *this,storage_t c)

{
  vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true> *this_00;
  RowGroupCollection *pRVar1;
  idx_t start_row;
  unsigned_long params_1;
  MetaBlockPointer pointer;
  type paVar2;
  reference pvVar3;
  type pCVar4;
  MetadataManager *manager;
  reference pvVar5;
  const_reference type;
  ColumnData *pCVar6;
  InternalException *pIVar7;
  pthread_mutex_t *__mutex;
  allocator local_d9;
  pthread_mutex_t *local_d8;
  DataTableInfo *local_d0;
  BlockManager *local_c8;
  undefined1 local_c0 [32];
  MetadataReader column_data_reader;
  
  if ((this->is_loaded).
      super_unique_ptr<std::atomic<bool>[],_std::default_delete<std::atomic<bool>[]>_>._M_t.
      super___uniq_ptr_impl<std::atomic<bool>,_std::default_delete<std::atomic<bool>[]>_>._M_t.
      super__Tuple_impl<0UL,_std::atomic<bool>_*,_std::default_delete<std::atomic<bool>[]>_>.
      super__Head_base<0UL,_std::atomic<bool>_*,_false>._M_head_impl != (atomic<bool> *)0x0) {
    paVar2 = unique_ptr<std::atomic<bool>[],_std::default_delete<std::atomic<bool>[]>,_true>::
             operator[](&this->is_loaded,c);
    if (((paVar2->_M_base)._M_i & 1U) == 0) {
      __mutex = (pthread_mutex_t *)&this->row_group_lock;
      ::std::mutex::lock((mutex *)&__mutex->__data);
      this_00 = &this->columns;
      pvVar3 = vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true>::get<true>(this_00,c);
      if ((pvVar3->internal).super___shared_ptr<duckdb::ColumnData,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        local_d8 = __mutex;
        if ((long)(this->column_pointers).
                  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
                  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->column_pointers).
                  super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
                  super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
            (long)(this->columns).
                  super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                  .
                  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->columns).
                  super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                  .
                  super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
          pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&column_data_reader,
                     "Lazy loading a column but the pointer was not set",(allocator *)local_c0);
          InternalException::InternalException(pIVar7,(string *)&column_data_reader);
          __cxa_throw(pIVar7,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        manager = RowGroupCollection::GetMetadataManager((this->collection)._M_data);
        pRVar1 = (this->collection)._M_data;
        pvVar5 = vector<duckdb::MetaBlockPointer,_true>::get<true>(&this->column_pointers,c);
        pointer.block_pointer = pvVar5->block_pointer;
        pointer.offset = pvVar5->offset;
        pointer.unused_padding = pvVar5->unused_padding;
        MetadataReader::MetadataReader
                  (&column_data_reader,manager,pointer,
                   (optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>)0x0,
                   EXISTING_BLOCKS);
        local_c8 = ((this->collection)._M_data)->block_manager;
        local_d0 = GetTableInfo(this);
        start_row = (this->super_SegmentBase<duckdb::RowGroup>).start;
        type = vector<duckdb::LogicalType,_true>::get<true>(&pRVar1->types,c);
        ColumnData::Deserialize
                  ((ColumnData *)local_c0,local_c8,local_d0,c,start_row,
                   &column_data_reader.super_ReadStream,type);
        pvVar3 = vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true>::get<true>(this_00,c);
        shared_ptr<duckdb::ColumnData,_true>::operator=
                  (pvVar3,(shared_ptr<duckdb::ColumnData,_true> *)local_c0);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
        __mutex = local_d8;
        paVar2 = unique_ptr<std::atomic<bool>[],_std::default_delete<std::atomic<bool>[]>,_true>::
                 operator[](&this->is_loaded,c);
        LOCK();
        (paVar2->_M_base)._M_i = true;
        UNLOCK();
        pvVar3 = vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true>::get<true>(this_00,c);
        pCVar6 = shared_ptr<duckdb::ColumnData,_true>::operator->(pvVar3);
        if ((pCVar6->count).super___atomic_base<unsigned_long>._M_i !=
            (this->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>.
            _M_i) {
          pIVar7 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)local_c0,
                     "Corrupted database - loaded column with index %llu at row start %llu, count %llu did not match count of row group %llu"
                     ,&local_d9);
          params_1 = (this->super_SegmentBase<duckdb::RowGroup>).start;
          pvVar3 = vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true>::get<true>(this_00,c);
          pCVar6 = shared_ptr<duckdb::ColumnData,_true>::operator->(pvVar3);
          InternalException::
          InternalException<unsigned_long,unsigned_long,unsigned_long,unsigned_long>
                    (pIVar7,(string *)local_c0,c,params_1,
                     (pCVar6->count).super___atomic_base<unsigned_long>._M_i,
                     (this->super_SegmentBase<duckdb::RowGroup>).count.
                     super___atomic_base<unsigned_long>._M_i);
          __cxa_throw(pIVar7,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pvVar3 = vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true>::get<true>(this_00,c);
        pCVar4 = shared_ptr<duckdb::ColumnData,_true>::operator*(pvVar3);
        MetadataReader::~MetadataReader(&column_data_reader);
      }
      else {
        pvVar3 = vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true>::get<true>(this_00,c);
        pCVar4 = shared_ptr<duckdb::ColumnData,_true>::operator*(pvVar3);
      }
      pthread_mutex_unlock(__mutex);
      return pCVar4;
    }
  }
  pvVar3 = vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true>::get<true>(&this->columns,c);
  pCVar4 = shared_ptr<duckdb::ColumnData,_true>::operator*(pvVar3);
  return pCVar4;
}

Assistant:

ColumnData &RowGroup::GetColumn(storage_t c) {
	D_ASSERT(c < columns.size());
	if (!is_loaded) {
		// not being lazy loaded
		D_ASSERT(columns[c]);
		return *columns[c];
	}
	if (is_loaded[c]) {
		D_ASSERT(columns[c]);
		return *columns[c];
	}
	lock_guard<mutex> l(row_group_lock);
	if (columns[c]) {
		D_ASSERT(is_loaded[c]);
		return *columns[c];
	}
	if (column_pointers.size() != columns.size()) {
		throw InternalException("Lazy loading a column but the pointer was not set");
	}
	auto &metadata_manager = GetCollection().GetMetadataManager();
	auto &types = GetCollection().GetTypes();
	auto &block_pointer = column_pointers[c];
	MetadataReader column_data_reader(metadata_manager, block_pointer);
	this->columns[c] =
	    ColumnData::Deserialize(GetBlockManager(), GetTableInfo(), c, start, column_data_reader, types[c]);
	is_loaded[c] = true;
	if (this->columns[c]->count != this->count) {
		throw InternalException("Corrupted database - loaded column with index %llu at row start %llu, count %llu did "
		                        "not match count of row group %llu",
		                        c, start, this->columns[c]->count.load(), this->count.load());
	}
	return *columns[c];
}